

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

bool __thiscall flatbuffers::cpp::CppGenerator::generate(CppGenerator *this)

{
  string *file_name;
  Namespace *name_space;
  StructDef *struct_def_00;
  bool bVar1;
  __type _Var2;
  char *pcVar3;
  vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_> *pvVar4;
  vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_> *pvVar5;
  reference ppEVar6;
  reference ppSVar7;
  long lVar8;
  bool local_1a23;
  bool local_1a22;
  undefined1 local_16c0 [8];
  string final_code;
  string file_path;
  allocator<char> local_1659;
  string local_1658;
  allocator<char> local_1631;
  string local_1630;
  allocator<char> local_1609;
  string local_1608;
  allocator<char> local_15e1;
  string local_15e0;
  allocator<char> local_15b9;
  string local_15b8;
  allocator<char> local_1591;
  string local_1590;
  allocator<char> local_1569;
  string local_1568;
  allocator<char> local_1541;
  string local_1540;
  allocator<char> local_1519;
  string local_1518;
  allocator<char> local_14f1;
  string local_14f0;
  allocator<char> local_14c9;
  string local_14c8;
  allocator<char> local_14a1;
  string local_14a0;
  allocator<char> local_1479;
  string local_1478;
  allocator<char> local_1451;
  string local_1450;
  string local_1430;
  allocator<char> local_1409;
  string local_1408;
  string local_13e8;
  allocator<char> local_13c1;
  string local_13c0;
  undefined1 local_13a0 [8];
  string native_name;
  string local_1378;
  allocator<char> local_1351;
  string local_1350;
  allocator<char> local_1329;
  string local_1328;
  allocator<char> local_1301;
  string local_1300;
  allocator<char> local_12d9;
  string local_12d8;
  string local_12b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1278;
  allocator<char> local_1251;
  string local_1250;
  allocator<char> local_1229;
  string local_1228;
  allocator<char> local_1201;
  string local_1200;
  allocator<char> local_11d9;
  string local_11d8;
  allocator<char> local_11b1;
  string local_11b0;
  allocator<char> local_1189;
  string local_1188;
  string local_1168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1128;
  allocator<char> local_1101;
  string local_1100;
  allocator<char> local_10d9;
  string local_10d8;
  allocator<char> local_10b1;
  string local_10b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1090;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1070;
  allocator<char> local_1049;
  string local_1048;
  allocator<char> local_1021;
  string local_1020;
  allocator<char> local_ff9;
  string local_ff8;
  allocator<char> local_fd1;
  string local_fd0;
  allocator<char> local_fa9;
  string local_fa8;
  allocator<char> local_f81;
  string local_f80;
  allocator<char> local_f59;
  string local_f58;
  allocator<char> local_f31;
  string local_f30;
  allocator<char> local_f09;
  string local_f08;
  allocator<char> local_ee1;
  string local_ee0;
  allocator<char> local_eb9;
  string local_eb8;
  allocator<char> local_e91;
  string local_e90;
  allocator<char> local_e69;
  string local_e68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e48;
  allocator<char> local_e21;
  string local_e20;
  allocator<char> local_df9;
  string local_df8;
  allocator<char> local_dd1;
  string local_dd0;
  allocator<char> local_da9;
  string local_da8;
  allocator<char> local_d81;
  string local_d80;
  allocator<char> local_d59;
  string local_d58;
  allocator<char> local_d31;
  string local_d30;
  allocator<char> local_d09;
  string local_d08;
  allocator<char> local_ce1;
  string local_ce0;
  allocator<char> local_cb9;
  string local_cb8;
  allocator<char> local_c91;
  string local_c90;
  allocator<char> local_c69;
  string local_c68;
  allocator<char> local_c41;
  string local_c40;
  allocator<char> local_c19;
  string local_c18;
  allocator<char> local_bf1;
  string local_bf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bb0;
  allocator<char> local_b89;
  string local_b88;
  allocator<char> local_b61;
  string local_b60;
  allocator<char> local_b39;
  string local_b38;
  allocator<char> local_b11;
  string local_b10;
  allocator<char> local_ae9;
  string local_ae8;
  allocator<char> local_ac1;
  string local_ac0;
  allocator<char> local_a99;
  string local_a98;
  allocator<char> local_a71;
  string local_a70;
  allocator<char> local_a49;
  string local_a48;
  allocator<char> local_a21;
  string local_a20;
  allocator<char> local_9f9;
  string local_9f8;
  allocator<char> local_9d1;
  string local_9d0;
  allocator<char> local_9a9;
  string local_9a8;
  allocator<char> local_981;
  string local_980;
  allocator<char> local_959;
  string local_958;
  allocator<char> local_931;
  string local_930;
  allocator<char> local_909;
  string local_908;
  allocator<char> local_8e1;
  string local_8e0;
  allocator<char> local_8b9;
  string local_8b8;
  allocator<char> local_891;
  string local_890;
  allocator<char> local_869;
  string local_868;
  allocator<char> local_841;
  string local_840;
  allocator<char> local_819;
  string local_818;
  string local_7f8;
  allocator<char> local_7d1;
  string local_7d0;
  allocator<char> local_7a9;
  string local_7a8;
  allocator<char> local_781;
  string local_780;
  undefined1 local_760 [8];
  string cpp_name;
  string qualified_name;
  string name;
  StructDef *struct_def_7;
  StructDef **struct_def_6;
  const_iterator __end3_3;
  const_iterator __begin3_3;
  vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_> *__range3_3;
  EnumDef **enum_def_2;
  const_iterator __end3_2;
  const_iterator __begin3_2;
  vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_> *__range3_2;
  EnumDef **enum_def_1;
  const_iterator __end2_5;
  const_iterator __begin2_5;
  vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_> *__range2_5;
  StructDef **struct_def_5;
  const_iterator __end2_4;
  const_iterator __begin2_4;
  vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_> *__range2_4;
  StructDef **struct_def_4;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_> *__range2_3;
  StructDef **struct_def_3;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_> *__range2_2;
  EnumDef **enum_def;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_> *__range2_1;
  StructDef **struct_def_2;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_> *__range3_1;
  string local_5f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  string local_4d0;
  undefined1 local_4b0 [8];
  string nativeName_1;
  StructDef **struct_def_1;
  const_iterator __end3;
  const_iterator __begin3;
  vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_> *__range3;
  string local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  string local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  undefined1 local_388 [8];
  string other_name;
  StructDef **other_struct_def;
  const_iterator __end5;
  const_iterator __begin5;
  vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_> *__range5;
  undefined1 local_328 [8];
  string nativeName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  string local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  reference local_248;
  StructDef **struct_def;
  const_iterator __end2;
  const_iterator __begin2;
  vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_> *__range2;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  allocator<char> local_159;
  string local_158;
  allocator<char> local_131;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  allocator<char> local_c9;
  string local_c8;
  undefined1 local_a8 [8];
  string include_guard;
  allocator<char> local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  CppGenerator *local_10;
  CppGenerator *this_local;
  
  local_10 = this;
  MarkIf64BitBuilderIsNeeded(this);
  CodeWriter::Clear(&this->code_);
  pcVar3 = BaseGenerator::FlatBuffersGeneratedWarning();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,pcVar3,&local_71);
  std::operator+(&local_50,"// ",&local_70);
  std::operator+(&local_30,&local_50,"\n\n");
  CodeWriter::operator+=(&this->code_,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  file_name = (this->super_BaseGenerator).file_name_;
  name_space = ((this->super_BaseGenerator).parser_)->current_namespace_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"",&local_c9);
  GenIncludeGuard((string *)local_a8,file_name,name_space,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::operator+(&local_f0,"#ifndef ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
  CodeWriter::operator+=(&this->code_,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::operator+(&local_110,"#define ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
  CodeWriter::operator+=(&this->code_,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"",&local_131);
  CodeWriter::operator+=(&this->code_,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  if (((this->opts_).super_IDLOptions.gen_nullable & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,"#pragma clang system_header\n\n",&local_159);
    CodeWriter::operator+=(&this->code_,&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator(&local_159);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"#include \"flatbuffers/flatbuffers.h\"",&local_181);
  CodeWriter::operator+=(&this->code_,&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  if ((((this->super_BaseGenerator).parser_)->uses_flexbuffers_ & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,"#include \"flatbuffers/flexbuffers.h\"",&local_1a9);
    CodeWriter::operator+=(&this->code_,&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::allocator<char>::~allocator(&local_1a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,"#include \"flatbuffers/flex_flat_util.h\"",&local_1d1);
    CodeWriter::operator+=(&this->code_,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"",&local_1f9);
  CodeWriter::operator+=(&this->code_,&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  GenFlatbuffersVersionCheck(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"",(allocator<char> *)((long)&__range2 + 7));
  CodeWriter::operator+=(&this->code_,&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
  if (((this->opts_).super_IDLOptions.include_dependence_headers & 1U) != 0) {
    GenIncludeDependencies(this);
  }
  GenExtraIncludes(this);
  GenEmbeddedIncludes(this);
  if (this->cur_name_space_ == (Namespace *)0x0) {
    pvVar4 = &(((this->super_BaseGenerator).parser_)->structs_).vec;
    __end2 = std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::begin
                       (pvVar4);
    struct_def = (StructDef **)
                 std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::
                 end(pvVar4);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
                                       *)&struct_def), bVar1) {
      local_248 = __gnu_cxx::
                  __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
                  ::operator*(&__end2);
      if ((((*local_248)->super_Definition).generated & 1U) == 0) {
        SetNameSpace(this,((*local_248)->super_Definition).defined_namespace);
        Name_abi_cxx11_(&local_2a8,this,&(*local_248)->super_Definition);
        std::operator+(&local_288,"struct ",&local_2a8);
        std::operator+(&local_268,&local_288,";");
        CodeWriter::operator+=(&this->code_,&local_268);
        std::__cxx11::string::~string((string *)&local_268);
        std::__cxx11::string::~string((string *)&local_288);
        std::__cxx11::string::~string((string *)&local_2a8);
        if (((*local_248)->fixed & 1U) == 0) {
          Name_abi_cxx11_((string *)((long)&nativeName.field_2 + 8),this,
                          &(*local_248)->super_Definition);
          std::operator+(&local_2e8,"struct ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&nativeName.field_2 + 8));
          std::operator+(&local_2c8,&local_2e8,"Builder;");
          CodeWriter::operator+=(&this->code_,&local_2c8);
          std::__cxx11::string::~string((string *)&local_2c8);
          std::__cxx11::string::~string((string *)&local_2e8);
          std::__cxx11::string::~string((string *)(nativeName.field_2._M_local_buf + 8));
        }
        if (((this->opts_).super_IDLOptions.generate_object_based_api & 1U) != 0) {
          Name_abi_cxx11_((string *)&__range5,this,&(*local_248)->super_Definition);
          NativeName((string *)local_328,(string *)&__range5,*local_248,
                     &(this->opts_).super_IDLOptions);
          std::__cxx11::string::~string((string *)&__range5);
          pvVar4 = &(((this->super_BaseGenerator).parser_)->structs_).vec;
          __end5 = std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                   ::begin(pvVar4);
          other_struct_def =
               (StructDef **)
               std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::end
                         (pvVar4);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end5,(__normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
                                             *)&other_struct_def), bVar1) {
            other_name.field_2._8_8_ =
                 __gnu_cxx::
                 __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
                 ::operator*(&__end5);
            if ((*(StructDef **)other_name.field_2._8_8_ != *local_248) &&
               (((*(StructDef **)other_name.field_2._8_8_)->super_Definition).defined_namespace ==
                ((*local_248)->super_Definition).defined_namespace)) {
              Name_abi_cxx11_((string *)local_388,this,
                              &(*(StructDef **)other_name.field_2._8_8_)->super_Definition);
              _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_328,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_388);
              if (_Var2) {
                Name_abi_cxx11_(&local_408,this,&(*local_248)->super_Definition);
                std::operator+(&local_3e8,"Generated Object API type for ",&local_408);
                std::operator+(&local_3c8,&local_3e8," collides with ");
                std::operator+(&local_3a8,&local_3c8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_388);
                LogCompilerError(&local_3a8);
                std::__cxx11::string::~string((string *)&local_3a8);
                std::__cxx11::string::~string((string *)&local_3c8);
                std::__cxx11::string::~string((string *)&local_3e8);
                std::__cxx11::string::~string((string *)&local_408);
              }
              std::__cxx11::string::~string((string *)local_388);
            }
            __gnu_cxx::
            __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
            ::operator++(&__end5);
          }
          if (((*local_248)->fixed & 1U) == 0) {
            std::operator+(&local_448,"struct ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_328);
            std::operator+(&local_428,&local_448,";");
            CodeWriter::operator+=(&this->code_,&local_428);
            std::__cxx11::string::~string((string *)&local_428);
            std::__cxx11::string::~string((string *)&local_448);
          }
          std::__cxx11::string::~string((string *)local_328);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_468,"",(allocator<char> *)((long)&__range3 + 7));
        CodeWriter::operator+=(&this->code_,&local_468);
        std::__cxx11::string::~string((string *)&local_468);
        std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
      }
      __gnu_cxx::
      __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
      ::operator++(&__end2);
    }
    if ((((this->opts_).super_IDLOptions.generate_object_based_api & 1U) != 0) &&
       (((this->opts_).super_IDLOptions.gen_compare & 1U) != 0)) {
      pvVar4 = &(((this->super_BaseGenerator).parser_)->structs_).vec;
      __end3 = std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::
               begin(pvVar4);
      struct_def_1 = (StructDef **)
                     std::
                     vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::
                     end(pvVar4);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
                                         *)&struct_def_1), bVar1) {
        nativeName_1.field_2._8_8_ =
             __gnu_cxx::
             __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
             ::operator*(&__end3);
        if ((((*(StructDef **)nativeName_1.field_2._8_8_)->super_Definition).generated & 1U) == 0) {
          SetNameSpace(this,((*(StructDef **)nativeName_1.field_2._8_8_)->super_Definition).
                            defined_namespace);
          Name_abi_cxx11_(&local_4d0,this,*(Definition **)nativeName_1.field_2._8_8_);
          NativeName((string *)local_4b0,&local_4d0,*(StructDef **)nativeName_1.field_2._8_8_,
                     &(this->opts_).super_IDLOptions);
          std::__cxx11::string::~string((string *)&local_4d0);
          std::operator+(&local_550,"bool operator==(const ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4b0);
          std::operator+(&local_530,&local_550," &lhs, const ");
          std::operator+(&local_510,&local_530,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4b0);
          std::operator+(&local_4f0,&local_510," &rhs);");
          CodeWriter::operator+=(&this->code_,&local_4f0);
          std::__cxx11::string::~string((string *)&local_4f0);
          std::__cxx11::string::~string((string *)&local_510);
          std::__cxx11::string::~string((string *)&local_530);
          std::__cxx11::string::~string((string *)&local_550);
          std::operator+(&local_5d0,"bool operator!=(const ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4b0);
          std::operator+(&local_5b0,&local_5d0," &lhs, const ");
          std::operator+(&local_590,&local_5b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4b0);
          std::operator+(&local_570,&local_590," &rhs);");
          CodeWriter::operator+=(&this->code_,&local_570);
          std::__cxx11::string::~string((string *)&local_570);
          std::__cxx11::string::~string((string *)&local_590);
          std::__cxx11::string::~string((string *)&local_5b0);
          std::__cxx11::string::~string((string *)&local_5d0);
          std::__cxx11::string::~string((string *)local_4b0);
        }
        __gnu_cxx::
        __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
        ::operator++(&__end3);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5f0,"",(allocator<char> *)((long)&__range3_1 + 7));
      CodeWriter::operator+=(&this->code_,&local_5f0);
      std::__cxx11::string::~string((string *)&local_5f0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range3_1 + 7));
    }
    if ((this->opts_).super_IDLOptions.mini_reflect != kNone) {
      pvVar4 = &(((this->super_BaseGenerator).parser_)->structs_).vec;
      __end3_1 = std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::
                 begin(pvVar4);
      struct_def_2 = (StructDef **)
                     std::
                     vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::
                     end(pvVar4);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3_1,
                                (__normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
                                 *)&struct_def_2), bVar1) {
        ppSVar7 = __gnu_cxx::
                  __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
                  ::operator*(&__end3_1);
        if ((((*ppSVar7)->super_Definition).generated & 1U) == 0) {
          SetNameSpace(this,((*ppSVar7)->super_Definition).defined_namespace);
          GenMiniReflectPre(this,*ppSVar7);
        }
        __gnu_cxx::
        __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
        ::operator++(&__end3_1);
      }
    }
    pvVar5 = &(((this->super_BaseGenerator).parser_)->enums_).vec;
    __end2_1 = std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>::begin
                         (pvVar5);
    enum_def = (EnumDef **)
               std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>::end
                         (pvVar5);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
                               *)&enum_def), bVar1) {
      ppEVar6 = __gnu_cxx::
                __normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
                ::operator*(&__end2_1);
      if ((((*ppEVar6)->super_Definition).generated & 1U) == 0) {
        SetNameSpace(this,((*ppEVar6)->super_Definition).defined_namespace);
        GenEnum(this,*ppEVar6);
      }
      __gnu_cxx::
      __normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
      ::operator++(&__end2_1);
    }
    pvVar4 = &(((this->super_BaseGenerator).parser_)->structs_).vec;
    __end2_2 = std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::
               begin(pvVar4);
    struct_def_3 = (StructDef **)
                   std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                   ::end(pvVar4);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_2,
                              (__normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
                               *)&struct_def_3), bVar1) {
      ppSVar7 = __gnu_cxx::
                __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
                ::operator*(&__end2_2);
      if ((((*ppSVar7)->fixed & 1U) != 0) && ((((*ppSVar7)->super_Definition).generated & 1U) == 0))
      {
        SetNameSpace(this,((*ppSVar7)->super_Definition).defined_namespace);
        GenStruct(this,*ppSVar7);
      }
      __gnu_cxx::
      __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
      ::operator++(&__end2_2);
    }
    pvVar4 = &(((this->super_BaseGenerator).parser_)->structs_).vec;
    __end2_3 = std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::
               begin(pvVar4);
    struct_def_4 = (StructDef **)
                   std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                   ::end(pvVar4);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_3,
                              (__normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
                               *)&struct_def_4), bVar1) {
      ppSVar7 = __gnu_cxx::
                __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
                ::operator*(&__end2_3);
      if ((((*ppSVar7)->fixed & 1U) == 0) && ((((*ppSVar7)->super_Definition).generated & 1U) == 0))
      {
        SetNameSpace(this,((*ppSVar7)->super_Definition).defined_namespace);
        GenTable(this,*ppSVar7);
      }
      __gnu_cxx::
      __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
      ::operator++(&__end2_3);
    }
    pvVar4 = &(((this->super_BaseGenerator).parser_)->structs_).vec;
    __end2_4 = std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::
               begin(pvVar4);
    struct_def_5 = (StructDef **)
                   std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                   ::end(pvVar4);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_4,
                              (__normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
                               *)&struct_def_5), bVar1) {
      ppSVar7 = __gnu_cxx::
                __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
                ::operator*(&__end2_4);
      if ((((*ppSVar7)->fixed & 1U) == 0) && ((((*ppSVar7)->super_Definition).generated & 1U) == 0))
      {
        SetNameSpace(this,((*ppSVar7)->super_Definition).defined_namespace);
        GenTablePost(this,*ppSVar7);
      }
      __gnu_cxx::
      __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
      ::operator++(&__end2_4);
    }
    pvVar5 = &(((this->super_BaseGenerator).parser_)->enums_).vec;
    __end2_5 = std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>::begin
                         (pvVar5);
    enum_def_1 = (EnumDef **)
                 std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>::end
                           (pvVar5);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_5,
                              (__normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
                               *)&enum_def_1), bVar1) {
      ppEVar6 = __gnu_cxx::
                __normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
                ::operator*(&__end2_5);
      if ((((*ppEVar6)->is_union & 1U) != 0) &&
         ((((*ppEVar6)->super_Definition).generated & 1U) == 0)) {
        SetNameSpace(this,((*ppEVar6)->super_Definition).defined_namespace);
        GenUnionPost(this,*ppEVar6);
      }
      __gnu_cxx::
      __normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
      ::operator++(&__end2_5);
    }
    if ((this->opts_).super_IDLOptions.mini_reflect != kNone) {
      pvVar5 = &(((this->super_BaseGenerator).parser_)->enums_).vec;
      __end3_2 = std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>::begin
                           (pvVar5);
      enum_def_2 = (EnumDef **)
                   std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>::end
                             (pvVar5);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3_2,
                                (__normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
                                 *)&enum_def_2), bVar1) {
        ppEVar6 = __gnu_cxx::
                  __normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
                  ::operator*(&__end3_2);
        if ((((*ppEVar6)->super_Definition).generated & 1U) == 0) {
          SetNameSpace(this,((*ppEVar6)->super_Definition).defined_namespace);
          GenMiniReflect(this,(StructDef *)0x0,*ppEVar6);
        }
        __gnu_cxx::
        __normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
        ::operator++(&__end3_2);
      }
      pvVar4 = &(((this->super_BaseGenerator).parser_)->structs_).vec;
      __end3_3 = std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::
                 begin(pvVar4);
      struct_def_6 = (StructDef **)
                     std::
                     vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::
                     end(pvVar4);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3_3,
                                (__normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
                                 *)&struct_def_6), bVar1) {
        ppSVar7 = __gnu_cxx::
                  __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
                  ::operator*(&__end3_3);
        if ((((*ppSVar7)->super_Definition).generated & 1U) == 0) {
          SetNameSpace(this,((*ppSVar7)->super_Definition).defined_namespace);
          GenMiniReflect(this,*ppSVar7,(EnumDef *)0x0);
        }
        __gnu_cxx::
        __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
        ::operator++(&__end3_3);
      }
    }
    if (((this->super_BaseGenerator).parser_)->root_struct_def_ != (StructDef *)0x0) {
      struct_def_00 = ((this->super_BaseGenerator).parser_)->root_struct_def_;
      SetNameSpace(this,(struct_def_00->super_Definition).defined_namespace);
      Name_abi_cxx11_((string *)((long)&qualified_name.field_2 + 8),this,
                      &struct_def_00->super_Definition);
      Namespace::GetFullyQualifiedName
                ((string *)((long)&cpp_name.field_2 + 8),this->cur_name_space_,
                 (string *)((long)&qualified_name.field_2 + 8),1000);
      TranslateNameSpace((string *)local_760,(string *)((long)&cpp_name.field_2 + 8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_780,"STRUCT_NAME",&local_781);
      CodeWriter::SetValue(&this->code_,&local_780,(string *)((long)&qualified_name.field_2 + 8));
      std::__cxx11::string::~string((string *)&local_780);
      std::allocator<char>::~allocator(&local_781);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_7a8,"CPP_NAME",&local_7a9)
      ;
      CodeWriter::SetValue(&this->code_,&local_7a8,(string *)local_760);
      std::__cxx11::string::~string((string *)&local_7a8);
      std::allocator<char>::~allocator(&local_7a9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7d0,"NULLABLE_EXT",&local_7d1);
      NullableExtension_abi_cxx11_(&local_7f8,this);
      CodeWriter::SetValue(&this->code_,&local_7d0,&local_7f8);
      std::__cxx11::string::~string((string *)&local_7f8);
      std::__cxx11::string::~string((string *)&local_7d0);
      std::allocator<char>::~allocator(&local_7d1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_818,"SIZE_T",&local_819);
      pcVar3 = "";
      if ((this->needs_64_bit_builder_ & 1U) != 0) {
        pcVar3 = ",::flatbuffers::uoffset64_t";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_840,pcVar3,&local_841);
      CodeWriter::SetValue(&this->code_,&local_818,&local_840);
      std::__cxx11::string::~string((string *)&local_840);
      std::allocator<char>::~allocator(&local_841);
      std::__cxx11::string::~string((string *)&local_818);
      std::allocator<char>::~allocator(&local_819);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_868,"inline \\",&local_869);
      CodeWriter::operator+=(&this->code_,&local_868);
      std::__cxx11::string::~string((string *)&local_868);
      std::allocator<char>::~allocator(&local_869);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_890,
                 "const {{CPP_NAME}} *{{NULLABLE_EXT}}Get{{STRUCT_NAME}}(const void *buf) {",
                 &local_891);
      CodeWriter::operator+=(&this->code_,&local_890);
      std::__cxx11::string::~string((string *)&local_890);
      std::allocator<char>::~allocator(&local_891);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_8b8,"  return ::flatbuffers::GetRoot<{{CPP_NAME}}>(buf);",
                 &local_8b9);
      CodeWriter::operator+=(&this->code_,&local_8b8);
      std::__cxx11::string::~string((string *)&local_8b8);
      std::allocator<char>::~allocator(&local_8b9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_8e0,"}",&local_8e1);
      CodeWriter::operator+=(&this->code_,&local_8e0);
      std::__cxx11::string::~string((string *)&local_8e0);
      std::allocator<char>::~allocator(&local_8e1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_908,"",&local_909);
      CodeWriter::operator+=(&this->code_,&local_908);
      std::__cxx11::string::~string((string *)&local_908);
      std::allocator<char>::~allocator(&local_909);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_930,"inline \\",&local_931);
      CodeWriter::operator+=(&this->code_,&local_930);
      std::__cxx11::string::~string((string *)&local_930);
      std::allocator<char>::~allocator(&local_931);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_958,
                 "const {{CPP_NAME}} *{{NULLABLE_EXT}}GetSizePrefixed{{STRUCT_NAME}}(const void *buf) {"
                 ,&local_959);
      CodeWriter::operator+=(&this->code_,&local_958);
      std::__cxx11::string::~string((string *)&local_958);
      std::allocator<char>::~allocator(&local_959);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_980,
                 "  return ::flatbuffers::GetSizePrefixedRoot<{{CPP_NAME}}{{SIZE_T}}>(buf);",
                 &local_981);
      CodeWriter::operator+=(&this->code_,&local_980);
      std::__cxx11::string::~string((string *)&local_980);
      std::allocator<char>::~allocator(&local_981);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_9a8,"}",&local_9a9);
      CodeWriter::operator+=(&this->code_,&local_9a8);
      std::__cxx11::string::~string((string *)&local_9a8);
      std::allocator<char>::~allocator(&local_9a9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_9d0,"",&local_9d1);
      CodeWriter::operator+=(&this->code_,&local_9d0);
      std::__cxx11::string::~string((string *)&local_9d0);
      std::allocator<char>::~allocator(&local_9d1);
      if (((this->opts_).super_IDLOptions.mutable_buffer & 1U) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_9f8,"inline \\",&local_9f9);
        CodeWriter::operator+=(&this->code_,&local_9f8);
        std::__cxx11::string::~string((string *)&local_9f8);
        std::allocator<char>::~allocator(&local_9f9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a20,"{{STRUCT_NAME}} *GetMutable{{STRUCT_NAME}}(void *buf) {",
                   &local_a21);
        CodeWriter::operator+=(&this->code_,&local_a20);
        std::__cxx11::string::~string((string *)&local_a20);
        std::allocator<char>::~allocator(&local_a21);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a48,
                   "  return ::flatbuffers::GetMutableRoot<{{STRUCT_NAME}}>(buf);",&local_a49);
        CodeWriter::operator+=(&this->code_,&local_a48);
        std::__cxx11::string::~string((string *)&local_a48);
        std::allocator<char>::~allocator(&local_a49);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_a70,"}",&local_a71);
        CodeWriter::operator+=(&this->code_,&local_a70);
        std::__cxx11::string::~string((string *)&local_a70);
        std::allocator<char>::~allocator(&local_a71);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_a98,"",&local_a99);
        CodeWriter::operator+=(&this->code_,&local_a98);
        std::__cxx11::string::~string((string *)&local_a98);
        std::allocator<char>::~allocator(&local_a99);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ac0,"inline \\",&local_ac1);
        CodeWriter::operator+=(&this->code_,&local_ac0);
        std::__cxx11::string::~string((string *)&local_ac0);
        std::allocator<char>::~allocator(&local_ac1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ae8,
                   "{{CPP_NAME}} *{{NULLABLE_EXT}}GetMutableSizePrefixed{{STRUCT_NAME}}(void *buf) {"
                   ,&local_ae9);
        CodeWriter::operator+=(&this->code_,&local_ae8);
        std::__cxx11::string::~string((string *)&local_ae8);
        std::allocator<char>::~allocator(&local_ae9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b10,
                   "  return ::flatbuffers::GetMutableSizePrefixedRoot<{{CPP_NAME}}{{SIZE_T}}>(buf);"
                   ,&local_b11);
        CodeWriter::operator+=(&this->code_,&local_b10);
        std::__cxx11::string::~string((string *)&local_b10);
        std::allocator<char>::~allocator(&local_b11);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_b38,"}",&local_b39);
        CodeWriter::operator+=(&this->code_,&local_b38);
        std::__cxx11::string::~string((string *)&local_b38);
        std::allocator<char>::~allocator(&local_b39);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_b60,"",&local_b61);
        CodeWriter::operator+=(&this->code_,&local_b60);
        std::__cxx11::string::~string((string *)&local_b60);
        std::allocator<char>::~allocator(&local_b61);
      }
      lVar8 = std::__cxx11::string::length();
      if (lVar8 != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b88,"inline const char *{{STRUCT_NAME}}Identifier() {",
                   &local_b89);
        CodeWriter::operator+=(&this->code_,&local_b88);
        std::__cxx11::string::~string((string *)&local_b88);
        std::allocator<char>::~allocator(&local_b89);
        std::operator+(&local_bd0,"  return \"",
                       &((this->super_BaseGenerator).parser_)->file_identifier_);
        std::operator+(&local_bb0,&local_bd0,"\";");
        CodeWriter::operator+=(&this->code_,&local_bb0);
        std::__cxx11::string::~string((string *)&local_bb0);
        std::__cxx11::string::~string((string *)&local_bd0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_bf0,"}",&local_bf1);
        CodeWriter::operator+=(&this->code_,&local_bf0);
        std::__cxx11::string::~string((string *)&local_bf0);
        std::allocator<char>::~allocator(&local_bf1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_c18,"",&local_c19);
        CodeWriter::operator+=(&this->code_,&local_c18);
        std::__cxx11::string::~string((string *)&local_c18);
        std::allocator<char>::~allocator(&local_c19);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c40,"inline \\",&local_c41);
        CodeWriter::operator+=(&this->code_,&local_c40);
        std::__cxx11::string::~string((string *)&local_c40);
        std::allocator<char>::~allocator(&local_c41);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c68,"bool {{STRUCT_NAME}}BufferHasIdentifier(const void *buf) {"
                   ,&local_c69);
        CodeWriter::operator+=(&this->code_,&local_c68);
        std::__cxx11::string::~string((string *)&local_c68);
        std::allocator<char>::~allocator(&local_c69);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c90,"  return ::flatbuffers::BufferHasIdentifier(",&local_c91);
        CodeWriter::operator+=(&this->code_,&local_c90);
        std::__cxx11::string::~string((string *)&local_c90);
        std::allocator<char>::~allocator(&local_c91);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_cb8,"      buf, {{STRUCT_NAME}}Identifier());",&local_cb9);
        CodeWriter::operator+=(&this->code_,&local_cb8);
        std::__cxx11::string::~string((string *)&local_cb8);
        std::allocator<char>::~allocator(&local_cb9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_ce0,"}",&local_ce1);
        CodeWriter::operator+=(&this->code_,&local_ce0);
        std::__cxx11::string::~string((string *)&local_ce0);
        std::allocator<char>::~allocator(&local_ce1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_d08,"",&local_d09);
        CodeWriter::operator+=(&this->code_,&local_d08);
        std::__cxx11::string::~string((string *)&local_d08);
        std::allocator<char>::~allocator(&local_d09);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d30,"inline \\",&local_d31);
        CodeWriter::operator+=(&this->code_,&local_d30);
        std::__cxx11::string::~string((string *)&local_d30);
        std::allocator<char>::~allocator(&local_d31);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d58,
                   "bool SizePrefixed{{STRUCT_NAME}}BufferHasIdentifier(const void *buf) {",
                   &local_d59);
        CodeWriter::operator+=(&this->code_,&local_d58);
        std::__cxx11::string::~string((string *)&local_d58);
        std::allocator<char>::~allocator(&local_d59);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d80,"  return ::flatbuffers::BufferHasIdentifier(",&local_d81);
        CodeWriter::operator+=(&this->code_,&local_d80);
        std::__cxx11::string::~string((string *)&local_d80);
        std::allocator<char>::~allocator(&local_d81);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_da8,"      buf, {{STRUCT_NAME}}Identifier(), true);",&local_da9)
        ;
        CodeWriter::operator+=(&this->code_,&local_da8);
        std::__cxx11::string::~string((string *)&local_da8);
        std::allocator<char>::~allocator(&local_da9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_dd0,"}",&local_dd1);
        CodeWriter::operator+=(&this->code_,&local_dd0);
        std::__cxx11::string::~string((string *)&local_dd0);
        std::allocator<char>::~allocator(&local_dd1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_df8,"",&local_df9);
        CodeWriter::operator+=(&this->code_,&local_df8);
        std::__cxx11::string::~string((string *)&local_df8);
        std::allocator<char>::~allocator(&local_df9);
      }
      lVar8 = std::__cxx11::string::length();
      if (lVar8 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_e68,"ID",&local_e69);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e90,"nullptr",&local_e91);
        CodeWriter::SetValue(&this->code_,&local_e68,&local_e90);
        std::__cxx11::string::~string((string *)&local_e90);
        std::allocator<char>::~allocator(&local_e91);
        std::__cxx11::string::~string((string *)&local_e68);
        std::allocator<char>::~allocator(&local_e69);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_e20,"ID",&local_e21);
        std::operator+(&local_e48,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&qualified_name.field_2 + 8),"Identifier()");
        CodeWriter::SetValue(&this->code_,&local_e20,&local_e48);
        std::__cxx11::string::~string((string *)&local_e48);
        std::__cxx11::string::~string((string *)&local_e20);
        std::allocator<char>::~allocator(&local_e21);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_eb8,"inline bool Verify{{STRUCT_NAME}}Buffer(",&local_eb9);
      CodeWriter::operator+=(&this->code_,&local_eb8);
      std::__cxx11::string::~string((string *)&local_eb8);
      std::allocator<char>::~allocator(&local_eb9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ee0,"    ::flatbuffers::Verifier &verifier) {",&local_ee1);
      CodeWriter::operator+=(&this->code_,&local_ee0);
      std::__cxx11::string::~string((string *)&local_ee0);
      std::allocator<char>::~allocator(&local_ee1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f08,"  return verifier.VerifyBuffer<{{CPP_NAME}}>({{ID}});",
                 &local_f09);
      CodeWriter::operator+=(&this->code_,&local_f08);
      std::__cxx11::string::~string((string *)&local_f08);
      std::allocator<char>::~allocator(&local_f09);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_f30,"}",&local_f31);
      CodeWriter::operator+=(&this->code_,&local_f30);
      std::__cxx11::string::~string((string *)&local_f30);
      std::allocator<char>::~allocator(&local_f31);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_f58,"",&local_f59);
      CodeWriter::operator+=(&this->code_,&local_f58);
      std::__cxx11::string::~string((string *)&local_f58);
      std::allocator<char>::~allocator(&local_f59);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f80,"inline bool VerifySizePrefixed{{STRUCT_NAME}}Buffer(",
                 &local_f81);
      CodeWriter::operator+=(&this->code_,&local_f80);
      std::__cxx11::string::~string((string *)&local_f80);
      std::allocator<char>::~allocator(&local_f81);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_fa8,"    ::flatbuffers::Verifier &verifier) {",&local_fa9);
      CodeWriter::operator+=(&this->code_,&local_fa8);
      std::__cxx11::string::~string((string *)&local_fa8);
      std::allocator<char>::~allocator(&local_fa9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_fd0,
                 "  return verifier.VerifySizePrefixedBuffer<{{CPP_NAME}}{{SIZE_T}}>({{ID}});",
                 &local_fd1);
      CodeWriter::operator+=(&this->code_,&local_fd0);
      std::__cxx11::string::~string((string *)&local_fd0);
      std::allocator<char>::~allocator(&local_fd1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_ff8,"}",&local_ff9);
      CodeWriter::operator+=(&this->code_,&local_ff8);
      std::__cxx11::string::~string((string *)&local_ff8);
      std::allocator<char>::~allocator(&local_ff9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1020,"",&local_1021);
      CodeWriter::operator+=(&this->code_,&local_1020);
      std::__cxx11::string::~string((string *)&local_1020);
      std::allocator<char>::~allocator(&local_1021);
      lVar8 = std::__cxx11::string::length();
      if (lVar8 != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1048,"inline const char *{{STRUCT_NAME}}Extension() {",
                   &local_1049);
        CodeWriter::operator+=(&this->code_,&local_1048);
        std::__cxx11::string::~string((string *)&local_1048);
        std::allocator<char>::~allocator(&local_1049);
        std::operator+(&local_1090,"  return \"",
                       &((this->super_BaseGenerator).parser_)->file_extension_);
        std::operator+(&local_1070,&local_1090,"\";");
        CodeWriter::operator+=(&this->code_,&local_1070);
        std::__cxx11::string::~string((string *)&local_1070);
        std::__cxx11::string::~string((string *)&local_1090);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_10b0,"}",&local_10b1);
        CodeWriter::operator+=(&this->code_,&local_10b0);
        std::__cxx11::string::~string((string *)&local_10b0);
        std::allocator<char>::~allocator(&local_10b1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_10d8,"",&local_10d9);
        CodeWriter::operator+=(&this->code_,&local_10d8);
        std::__cxx11::string::~string((string *)&local_10d8);
        std::allocator<char>::~allocator(&local_10d9);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1100,"inline void Finish{{STRUCT_NAME}}Buffer(",&local_1101);
      CodeWriter::operator+=(&this->code_,&local_1100);
      std::__cxx11::string::~string((string *)&local_1100);
      std::allocator<char>::~allocator(&local_1101);
      GetBuilder_abi_cxx11_(&local_1168,this);
      std::operator+(&local_1148,"    ",&local_1168);
      std::operator+(&local_1128,&local_1148," &fbb,");
      CodeWriter::operator+=(&this->code_,&local_1128);
      std::__cxx11::string::~string((string *)&local_1128);
      std::__cxx11::string::~string((string *)&local_1148);
      std::__cxx11::string::~string((string *)&local_1168);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1188,"    ::flatbuffers::Offset<{{CPP_NAME}}> root) {",&local_1189
                );
      CodeWriter::operator+=(&this->code_,&local_1188);
      std::__cxx11::string::~string((string *)&local_1188);
      std::allocator<char>::~allocator(&local_1189);
      lVar8 = std::__cxx11::string::length();
      if (lVar8 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_11d8,"  fbb.Finish(root);",&local_11d9);
        CodeWriter::operator+=(&this->code_,&local_11d8);
        std::__cxx11::string::~string((string *)&local_11d8);
        std::allocator<char>::~allocator(&local_11d9);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_11b0,"  fbb.Finish(root, {{STRUCT_NAME}}Identifier());",
                   &local_11b1);
        CodeWriter::operator+=(&this->code_,&local_11b0);
        std::__cxx11::string::~string((string *)&local_11b0);
        std::allocator<char>::~allocator(&local_11b1);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1200,"}",&local_1201);
      CodeWriter::operator+=(&this->code_,&local_1200);
      std::__cxx11::string::~string((string *)&local_1200);
      std::allocator<char>::~allocator(&local_1201);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1228,"",&local_1229);
      CodeWriter::operator+=(&this->code_,&local_1228);
      std::__cxx11::string::~string((string *)&local_1228);
      std::allocator<char>::~allocator(&local_1229);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1250,"inline void FinishSizePrefixed{{STRUCT_NAME}}Buffer(",
                 &local_1251);
      CodeWriter::operator+=(&this->code_,&local_1250);
      std::__cxx11::string::~string((string *)&local_1250);
      std::allocator<char>::~allocator(&local_1251);
      GetBuilder_abi_cxx11_(&local_12b8,this);
      std::operator+(&local_1298,"    ",&local_12b8);
      std::operator+(&local_1278,&local_1298," &fbb,");
      CodeWriter::operator+=(&this->code_,&local_1278);
      std::__cxx11::string::~string((string *)&local_1278);
      std::__cxx11::string::~string((string *)&local_1298);
      std::__cxx11::string::~string((string *)&local_12b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_12d8,"    ::flatbuffers::Offset<{{CPP_NAME}}> root) {",&local_12d9
                );
      CodeWriter::operator+=(&this->code_,&local_12d8);
      std::__cxx11::string::~string((string *)&local_12d8);
      std::allocator<char>::~allocator(&local_12d9);
      lVar8 = std::__cxx11::string::length();
      if (lVar8 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1328,"  fbb.FinishSizePrefixed(root);",&local_1329);
        CodeWriter::operator+=(&this->code_,&local_1328);
        std::__cxx11::string::~string((string *)&local_1328);
        std::allocator<char>::~allocator(&local_1329);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1300,
                   "  fbb.FinishSizePrefixed(root, {{STRUCT_NAME}}Identifier());",&local_1301);
        CodeWriter::operator+=(&this->code_,&local_1300);
        std::__cxx11::string::~string((string *)&local_1300);
        std::allocator<char>::~allocator(&local_1301);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1350,"}",&local_1351);
      CodeWriter::operator+=(&this->code_,&local_1350);
      std::__cxx11::string::~string((string *)&local_1350);
      std::allocator<char>::~allocator(&local_1351);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1378,"",
                 (allocator<char> *)(native_name.field_2._M_local_buf + 0xf));
      CodeWriter::operator+=(&this->code_,&local_1378);
      std::__cxx11::string::~string((string *)&local_1378);
      std::allocator<char>::~allocator((allocator<char> *)(native_name.field_2._M_local_buf + 0xf));
      if (((this->opts_).super_IDLOptions.generate_object_based_api & 1U) != 0) {
        WrapNativeNameInNameSpace_abi_cxx11_
                  ((string *)local_13a0,this,struct_def_00,&(this->opts_).super_IDLOptions);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_13c0,"UNPACK_RETURN",&local_13c1);
        GenTypeNativePtr(&local_13e8,this,(string *)local_13a0,(FieldDef *)0x0,false);
        CodeWriter::SetValue(&this->code_,&local_13c0,&local_13e8);
        std::__cxx11::string::~string((string *)&local_13e8);
        std::__cxx11::string::~string((string *)&local_13c0);
        std::allocator<char>::~allocator(&local_13c1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1408,"UNPACK_TYPE",&local_1409);
        GenTypeNativePtr(&local_1430,this,(string *)local_13a0,(FieldDef *)0x0,true);
        CodeWriter::SetValue(&this->code_,&local_1408,&local_1430);
        std::__cxx11::string::~string((string *)&local_1430);
        std::__cxx11::string::~string((string *)&local_1408);
        std::allocator<char>::~allocator(&local_1409);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1450,"inline {{UNPACK_RETURN}} UnPack{{STRUCT_NAME}}(",
                   &local_1451);
        CodeWriter::operator+=(&this->code_,&local_1450);
        std::__cxx11::string::~string((string *)&local_1450);
        std::allocator<char>::~allocator(&local_1451);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1478,"    const void *buf,",&local_1479);
        CodeWriter::operator+=(&this->code_,&local_1478);
        std::__cxx11::string::~string((string *)&local_1478);
        std::allocator<char>::~allocator(&local_1479);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_14a0,
                   "    const ::flatbuffers::resolver_function_t *res = nullptr) {",&local_14a1);
        CodeWriter::operator+=(&this->code_,&local_14a0);
        std::__cxx11::string::~string((string *)&local_14a0);
        std::allocator<char>::~allocator(&local_14a1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_14c8,"  return {{UNPACK_TYPE}}\\",&local_14c9);
        CodeWriter::operator+=(&this->code_,&local_14c8);
        std::__cxx11::string::~string((string *)&local_14c8);
        std::allocator<char>::~allocator(&local_14c9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_14f0,"(Get{{STRUCT_NAME}}(buf)->UnPack(res));",&local_14f1);
        CodeWriter::operator+=(&this->code_,&local_14f0);
        std::__cxx11::string::~string((string *)&local_14f0);
        std::allocator<char>::~allocator(&local_14f1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1518,"}",&local_1519);
        CodeWriter::operator+=(&this->code_,&local_1518);
        std::__cxx11::string::~string((string *)&local_1518);
        std::allocator<char>::~allocator(&local_1519);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1540,"",&local_1541);
        CodeWriter::operator+=(&this->code_,&local_1540);
        std::__cxx11::string::~string((string *)&local_1540);
        std::allocator<char>::~allocator(&local_1541);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1568,
                   "inline {{UNPACK_RETURN}} UnPackSizePrefixed{{STRUCT_NAME}}(",&local_1569);
        CodeWriter::operator+=(&this->code_,&local_1568);
        std::__cxx11::string::~string((string *)&local_1568);
        std::allocator<char>::~allocator(&local_1569);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1590,"    const void *buf,",&local_1591);
        CodeWriter::operator+=(&this->code_,&local_1590);
        std::__cxx11::string::~string((string *)&local_1590);
        std::allocator<char>::~allocator(&local_1591);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_15b8,
                   "    const ::flatbuffers::resolver_function_t *res = nullptr) {",&local_15b9);
        CodeWriter::operator+=(&this->code_,&local_15b8);
        std::__cxx11::string::~string((string *)&local_15b8);
        std::allocator<char>::~allocator(&local_15b9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_15e0,"  return {{UNPACK_TYPE}}\\",&local_15e1);
        CodeWriter::operator+=(&this->code_,&local_15e0);
        std::__cxx11::string::~string((string *)&local_15e0);
        std::allocator<char>::~allocator(&local_15e1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1608,"(GetSizePrefixed{{STRUCT_NAME}}(buf)->UnPack(res));",
                   &local_1609);
        CodeWriter::operator+=(&this->code_,&local_1608);
        std::__cxx11::string::~string((string *)&local_1608);
        std::allocator<char>::~allocator(&local_1609);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1630,"}",&local_1631);
        CodeWriter::operator+=(&this->code_,&local_1630);
        std::__cxx11::string::~string((string *)&local_1630);
        std::allocator<char>::~allocator(&local_1631);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1658,"",&local_1659);
        CodeWriter::operator+=(&this->code_,&local_1658);
        std::__cxx11::string::~string((string *)&local_1658);
        std::allocator<char>::~allocator(&local_1659);
        std::__cxx11::string::~string((string *)local_13a0);
      }
      std::__cxx11::string::~string((string *)local_760);
      std::__cxx11::string::~string((string *)(cpp_name.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(qualified_name.field_2._M_local_buf + 8));
    }
    if (this->cur_name_space_ != (Namespace *)0x0) {
      SetNameSpace(this,(Namespace *)0x0);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&file_path.field_2 + 8),"#endif  // ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
    CodeWriter::operator+=(&this->code_,(string *)((long)&file_path.field_2 + 8));
    std::__cxx11::string::~string((string *)(file_path.field_2._M_local_buf + 8));
    BaseGenerator::GeneratedFileName
              ((string *)((long)&final_code.field_2 + 8),&this->super_BaseGenerator,
               (this->super_BaseGenerator).path_,(this->super_BaseGenerator).file_name_,
               &(this->opts_).super_IDLOptions);
    CodeWriter::ToString_abi_cxx11_((string *)local_16c0,&this->code_);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    bVar1 = SaveFile(pcVar3,(string *)local_16c0,false);
    local_1a22 = false;
    if (bVar1) {
      local_1a23 = true;
      if (((((this->super_BaseGenerator).parser_)->opts).binary_schema_gen_embed & 1U) != 0) {
        local_1a23 = generate_bfbs_embed(this);
      }
      local_1a22 = local_1a23;
    }
    std::__cxx11::string::~string((string *)local_16c0);
    std::__cxx11::string::~string((string *)(final_code.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_a8);
    return local_1a22;
  }
  __assert_fail("!cur_name_space_",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_cpp.cpp"
                ,0x1c9,"virtual bool flatbuffers::cpp::CppGenerator::generate()");
}

Assistant:

bool generate() {
    // Check if we require a 64-bit flatbuffer builder.
    MarkIf64BitBuilderIsNeeded();

    code_.Clear();
    code_ += "// " + std::string(FlatBuffersGeneratedWarning()) + "\n\n";

    const auto include_guard =
        GenIncludeGuard(file_name_, *parser_.current_namespace_);
    code_ += "#ifndef " + include_guard;
    code_ += "#define " + include_guard;
    code_ += "";

    if (opts_.gen_nullable) { code_ += "#pragma clang system_header\n\n"; }

    code_ += "#include \"flatbuffers/flatbuffers.h\"";
    if (parser_.uses_flexbuffers_) {
      code_ += "#include \"flatbuffers/flexbuffers.h\"";
      code_ += "#include \"flatbuffers/flex_flat_util.h\"";
    }
    code_ += "";
    GenFlatbuffersVersionCheck();
    code_ += "";

    if (opts_.include_dependence_headers) { GenIncludeDependencies(); }
    GenExtraIncludes();
    GenEmbeddedIncludes();

    FLATBUFFERS_ASSERT(!cur_name_space_);

    // Generate forward declarations for all structs/tables, since they may
    // have circular references.
    for (const auto &struct_def : parser_.structs_.vec) {
      if (!struct_def->generated) {
        SetNameSpace(struct_def->defined_namespace);
        code_ += "struct " + Name(*struct_def) + ";";
        if (!struct_def->fixed) {
          code_ += "struct " + Name(*struct_def) + "Builder;";
        }
        if (opts_.generate_object_based_api) {
          auto nativeName = NativeName(Name(*struct_def), struct_def, opts_);

          // Check that nativeName doesn't collide the name of another struct.
          for (const auto &other_struct_def : parser_.structs_.vec) {
            if (other_struct_def == struct_def ||
                other_struct_def->defined_namespace !=
                    struct_def->defined_namespace) {
              continue;
            }

            auto other_name = Name(*other_struct_def);
            if (nativeName == other_name) {
              LogCompilerError("Generated Object API type for " +
                               Name(*struct_def) + " collides with " +
                               other_name);
              FLATBUFFERS_ASSERT(true);
            }
          }

          if (!struct_def->fixed) { code_ += "struct " + nativeName + ";"; }
        }
        code_ += "";
      }
    }

    // Generate forward declarations for all equal operators
    if (opts_.generate_object_based_api && opts_.gen_compare) {
      for (const auto &struct_def : parser_.structs_.vec) {
        if (!struct_def->generated) {
          SetNameSpace(struct_def->defined_namespace);
          auto nativeName = NativeName(Name(*struct_def), struct_def, opts_);
          code_ += "bool operator==(const " + nativeName + " &lhs, const " +
                   nativeName + " &rhs);";
          code_ += "bool operator!=(const " + nativeName + " &lhs, const " +
                   nativeName + " &rhs);";
        }
      }
      code_ += "";
    }

    // Generate preablmle code for mini reflection.
    if (opts_.mini_reflect != IDLOptions::kNone) {
      // To break cyclic dependencies, first pre-declare all tables/structs.
      for (const auto &struct_def : parser_.structs_.vec) {
        if (!struct_def->generated) {
          SetNameSpace(struct_def->defined_namespace);
          GenMiniReflectPre(struct_def);
        }
      }
    }

    // Generate code for all the enum declarations.
    for (const auto &enum_def : parser_.enums_.vec) {
      if (!enum_def->generated) {
        SetNameSpace(enum_def->defined_namespace);
        GenEnum(*enum_def);
      }
    }

    // Generate code for all structs, then all tables.
    for (const auto &struct_def : parser_.structs_.vec) {
      if (struct_def->fixed && !struct_def->generated) {
        SetNameSpace(struct_def->defined_namespace);
        GenStruct(*struct_def);
      }
    }
    for (const auto &struct_def : parser_.structs_.vec) {
      if (!struct_def->fixed && !struct_def->generated) {
        SetNameSpace(struct_def->defined_namespace);
        GenTable(*struct_def);
      }
    }
    for (const auto &struct_def : parser_.structs_.vec) {
      if (!struct_def->fixed && !struct_def->generated) {
        SetNameSpace(struct_def->defined_namespace);
        GenTablePost(*struct_def);
      }
    }

    // Generate code for union verifiers.
    for (const auto &enum_def : parser_.enums_.vec) {
      if (enum_def->is_union && !enum_def->generated) {
        SetNameSpace(enum_def->defined_namespace);
        GenUnionPost(*enum_def);
      }
    }

    // Generate code for mini reflection.
    if (opts_.mini_reflect != IDLOptions::kNone) {
      // Then the unions/enums that may refer to them.
      for (const auto &enum_def : parser_.enums_.vec) {
        if (!enum_def->generated) {
          SetNameSpace(enum_def->defined_namespace);
          GenMiniReflect(nullptr, enum_def);
        }
      }
      // Then the full tables/structs.
      for (const auto &struct_def : parser_.structs_.vec) {
        if (!struct_def->generated) {
          SetNameSpace(struct_def->defined_namespace);
          GenMiniReflect(struct_def, nullptr);
        }
      }
    }

    // Generate convenient global helper functions:
    if (parser_.root_struct_def_) {
      auto &struct_def = *parser_.root_struct_def_;
      SetNameSpace(struct_def.defined_namespace);
      auto name = Name(struct_def);
      auto qualified_name = cur_name_space_->GetFullyQualifiedName(name);
      auto cpp_name = TranslateNameSpace(qualified_name);

      code_.SetValue("STRUCT_NAME", name);
      code_.SetValue("CPP_NAME", cpp_name);
      code_.SetValue("NULLABLE_EXT", NullableExtension());
      code_.SetValue(
          "SIZE_T", needs_64_bit_builder_ ? ",::flatbuffers::uoffset64_t" : "");

      // The root datatype accessor:
      code_ += "inline \\";
      code_ +=
          "const {{CPP_NAME}} *{{NULLABLE_EXT}}Get{{STRUCT_NAME}}(const void "
          "*buf) {";
      code_ += "  return ::flatbuffers::GetRoot<{{CPP_NAME}}>(buf);";
      code_ += "}";
      code_ += "";

      code_ += "inline \\";
      code_ +=
          "const {{CPP_NAME}} "
          "*{{NULLABLE_EXT}}GetSizePrefixed{{STRUCT_NAME}}(const void "
          "*buf) {";
      code_ +=
          "  return "
          "::flatbuffers::GetSizePrefixedRoot<{{CPP_NAME}}{{SIZE_T}}>(buf);";
      code_ += "}";
      code_ += "";

      if (opts_.mutable_buffer) {
        code_ += "inline \\";
        code_ += "{{STRUCT_NAME}} *GetMutable{{STRUCT_NAME}}(void *buf) {";
        code_ +=
            "  return ::flatbuffers::GetMutableRoot<{{STRUCT_NAME}}>(buf);";
        code_ += "}";
        code_ += "";

        code_ += "inline \\";
        code_ +=
            "{{CPP_NAME}} "
            "*{{NULLABLE_EXT}}GetMutableSizePrefixed{{STRUCT_NAME}}(void "
            "*buf) {";
        code_ +=
            "  return "
            "::flatbuffers::GetMutableSizePrefixedRoot<{{CPP_NAME}}{{SIZE_T}}>("
            "buf);";
        code_ += "}";
        code_ += "";
      }

      if (parser_.file_identifier_.length()) {
        // Return the identifier
        code_ += "inline const char *{{STRUCT_NAME}}Identifier() {";
        code_ += "  return \"" + parser_.file_identifier_ + "\";";
        code_ += "}";
        code_ += "";

        // Check if a buffer has the identifier.
        code_ += "inline \\";
        code_ += "bool {{STRUCT_NAME}}BufferHasIdentifier(const void *buf) {";
        code_ += "  return ::flatbuffers::BufferHasIdentifier(";
        code_ += "      buf, {{STRUCT_NAME}}Identifier());";
        code_ += "}";
        code_ += "";

        // Check if a size-prefixed buffer has the identifier.
        code_ += "inline \\";
        code_ +=
            "bool SizePrefixed{{STRUCT_NAME}}BufferHasIdentifier(const void "
            "*buf) {";
        code_ += "  return ::flatbuffers::BufferHasIdentifier(";
        code_ += "      buf, {{STRUCT_NAME}}Identifier(), true);";
        code_ += "}";
        code_ += "";
      }

      // The root verifier.
      if (parser_.file_identifier_.length()) {
        code_.SetValue("ID", name + "Identifier()");
      } else {
        code_.SetValue("ID", "nullptr");
      }

      code_ += "inline bool Verify{{STRUCT_NAME}}Buffer(";
      code_ += "    ::flatbuffers::Verifier &verifier) {";
      code_ += "  return verifier.VerifyBuffer<{{CPP_NAME}}>({{ID}});";
      code_ += "}";
      code_ += "";

      code_ += "inline bool VerifySizePrefixed{{STRUCT_NAME}}Buffer(";
      code_ += "    ::flatbuffers::Verifier &verifier) {";
      code_ +=
          "  return "
          "verifier.VerifySizePrefixedBuffer<{{CPP_NAME}}{{SIZE_T}}>({{ID}});";
      code_ += "}";
      code_ += "";

      if (parser_.file_extension_.length()) {
        // Return the extension
        code_ += "inline const char *{{STRUCT_NAME}}Extension() {";
        code_ += "  return \"" + parser_.file_extension_ + "\";";
        code_ += "}";
        code_ += "";
      }

      // Finish a buffer with a given root object:
      code_ += "inline void Finish{{STRUCT_NAME}}Buffer(";
      code_ += "    " + GetBuilder() + " &fbb,";
      code_ += "    ::flatbuffers::Offset<{{CPP_NAME}}> root) {";
      if (parser_.file_identifier_.length())
        code_ += "  fbb.Finish(root, {{STRUCT_NAME}}Identifier());";
      else
        code_ += "  fbb.Finish(root);";
      code_ += "}";
      code_ += "";

      code_ += "inline void FinishSizePrefixed{{STRUCT_NAME}}Buffer(";
      code_ += "    " + GetBuilder() + " &fbb,";
      code_ += "    ::flatbuffers::Offset<{{CPP_NAME}}> root) {";
      if (parser_.file_identifier_.length())
        code_ += "  fbb.FinishSizePrefixed(root, {{STRUCT_NAME}}Identifier());";
      else
        code_ += "  fbb.FinishSizePrefixed(root);";
      code_ += "}";
      code_ += "";

      if (opts_.generate_object_based_api) {
        // A convenient root unpack function.
        auto native_name = WrapNativeNameInNameSpace(struct_def, opts_);
        code_.SetValue("UNPACK_RETURN",
                       GenTypeNativePtr(native_name, nullptr, false));
        code_.SetValue("UNPACK_TYPE",
                       GenTypeNativePtr(native_name, nullptr, true));

        code_ += "inline {{UNPACK_RETURN}} UnPack{{STRUCT_NAME}}(";
        code_ += "    const void *buf,";
        code_ +=
            "    const ::flatbuffers::resolver_function_t *res = nullptr) {";
        code_ += "  return {{UNPACK_TYPE}}\\";
        code_ += "(Get{{STRUCT_NAME}}(buf)->UnPack(res));";
        code_ += "}";
        code_ += "";

        code_ += "inline {{UNPACK_RETURN}} UnPackSizePrefixed{{STRUCT_NAME}}(";
        code_ += "    const void *buf,";
        code_ +=
            "    const ::flatbuffers::resolver_function_t *res = nullptr) {";
        code_ += "  return {{UNPACK_TYPE}}\\";
        code_ += "(GetSizePrefixed{{STRUCT_NAME}}(buf)->UnPack(res));";
        code_ += "}";
        code_ += "";
      }
    }

    if (cur_name_space_) SetNameSpace(nullptr);

    // Close the include guard.
    code_ += "#endif  // " + include_guard;

    const auto file_path = GeneratedFileName(path_, file_name_, opts_);
    const auto final_code = code_.ToString();

    // Save the file and optionally generate the binary schema code.
    return SaveFile(file_path.c_str(), final_code, false) &&
           (!parser_.opts.binary_schema_gen_embed || generate_bfbs_embed());
  }